

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

Frag __thiscall
re2::Regexp::Walker<re2::Frag>::WalkInternal
          (Walker<re2::Frag> *this,Regexp *re,Frag top_arg,bool use_copy)

{
  ushort uVar1;
  int iVar2;
  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
  *psVar3;
  Frag FVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  Frag FVar6;
  PatchList extraout_var_01;
  PatchList extraout_var_02;
  size_type sVar7;
  _Elt_pointer pWVar8;
  Frag *pFVar9;
  Regexp *pRVar10;
  deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *this_00;
  uint uVar11;
  bool stop;
  undefined1 local_1b0 [20];
  Frag local_19c;
  Frag FStack_194;
  Frag *local_188;
  PatchList extraout_var;
  PatchList extraout_var_00;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0);
    std::operator<<((ostream *)(local_1b0 + 8),"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    return top_arg;
  }
  this_00 = (deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *)
            this->stack_;
  local_1b0._0_8_ = re;
  local_1b0._12_8_ = top_arg;
  do {
    local_188 = (Frag *)0x0;
    local_1b0._8_4_ = -1;
    local_19c.begin = 0;
    local_19c.end.p = 0;
    FStack_194.begin = 0;
    FStack_194.end.p = 0;
    std::deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>>::
    emplace_back<re2::WalkState<re2::Frag>>(this_00,(WalkState<re2::Frag> *)local_1b0);
LAB_0012a424:
    psVar3 = this->stack_;
    pWVar8 = (psVar3->c).
             super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar8 == (psVar3->c).
                  super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pWVar8 = (psVar3->c).
               super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    pRVar10 = pWVar8[-1].re;
    uVar11 = pWVar8[-1].n;
    if (uVar11 == 0xffffffff) {
      iVar2 = this->max_visits_;
      this->max_visits_ = iVar2 + -1;
      if (iVar2 < 1) {
        this->stopped_early_ = true;
        FVar4.begin = (*this->_vptr_Walker[5])(this,pRVar10,pWVar8[-1].parent_arg);
        FVar4.end.p = extraout_var_02.p;
      }
      else {
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
        FVar4.begin = (*this->_vptr_Walker[2])(this,pRVar10,pWVar8[-1].parent_arg,local_1b0);
        FVar4.end.p = extraout_var.p;
        pWVar8[-1].pre_arg = FVar4;
        if (local_1b0[0] == '\0') {
          pWVar8[-1].n = 0;
          pWVar8[-1].child_args = (Frag *)0x0;
          uVar1 = pRVar10->nsub_;
          uVar11 = (uint)uVar1;
          if (uVar1 != 0) {
            if (uVar11 == 1) {
              pWVar8[-1].child_args = &pWVar8[-1].child_arg;
              uVar11 = 0;
            }
            else {
              pFVar9 = (Frag *)operator_new__((ulong)uVar1 << 3);
              memset(pFVar9,0,(ulong)uVar1 << 3);
              pWVar8[-1].child_args = pFVar9;
              uVar11 = pWVar8[-1].n;
            }
          }
          goto LAB_0012a450;
        }
      }
      goto LAB_0012a56d;
    }
LAB_0012a450:
    uVar1 = pRVar10->nsub_;
    if (uVar1 == 0) {
LAB_0012a51f:
      FVar4.begin = (*this->_vptr_Walker[3])
                              (this,pRVar10,pWVar8[-1].parent_arg,pWVar8[-1].pre_arg,
                               pWVar8[-1].child_args,(ulong)uVar11);
      FVar4.end.p = extraout_var_01.p;
      if ((1 < pRVar10->nsub_) && (pWVar8[-1].child_args != (Frag *)0x0)) {
        operator_delete__(pWVar8[-1].child_args);
      }
LAB_0012a56d:
      std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>::pop_back
                (&this->stack_->c);
      sVar7 = std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>::
              size(&this->stack_->c);
      if (sVar7 == 0) {
        return FVar4;
      }
      psVar3 = this->stack_;
      pWVar8 = (psVar3->c).
               super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar8 == (psVar3->c).
                    super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar8 = (psVar3->c).
                 super__Deque_base<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      if (pWVar8[-1].child_args == (Frag *)0x0) {
        pFVar9 = &pWVar8[-1].child_arg;
      }
      else {
        pFVar9 = pWVar8[-1].child_args + pWVar8[-1].n;
      }
      *pFVar9 = FVar4;
      pWVar8[-1].n = pWVar8[-1].n + 1;
      goto LAB_0012a424;
    }
    if (uVar1 == 1) {
      paVar5 = &pRVar10->field_5;
    }
    else {
      paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar10->field_5).submany_;
    }
    if ((int)(uint)uVar1 <= (int)uVar11) goto LAB_0012a51f;
    if (0 < (int)uVar11 && use_copy) {
      pRVar10 = (Regexp *)paVar5[uVar11].submany_;
      if ((Regexp *)paVar5[uVar11 - 1].submany_ != pRVar10) goto LAB_0012a603;
      FVar6.begin = (*this->_vptr_Walker[4])(this,pWVar8[-1].child_args[uVar11 - 1]);
      FVar6.end.p = extraout_var_00.p;
      pWVar8[-1].child_args[pWVar8[-1].n] = FVar6;
      pWVar8[-1].n = pWVar8[-1].n + 1;
      goto LAB_0012a424;
    }
    pRVar10 = (Regexp *)paVar5[(int)uVar11].submany_;
LAB_0012a603:
    this_00 = (deque<re2::WalkState<re2::Frag>,std::allocator<re2::WalkState<re2::Frag>>> *)
              this->stack_;
    local_1b0._12_8_ = pWVar8[-1].pre_arg;
    local_1b0._0_8_ = pRVar10;
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}